

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void InitUnigramTable(void)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  FILE *in_RSI;
  undefined4 *puVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double local_28;
  
  puVar6 = (undefined4 *)0x17d78400;
  table = (int *)malloc(400000000);
  if (table != (int *)0x0) {
    if (vocab_size < 1) {
      local_28 = 0.0;
    }
    else {
      local_28 = 0.0;
      lVar3 = 0;
      lVar7 = 0;
      do {
        dVar8 = pow((double)*(long *)((long)&vocab->cn + lVar3),0.75);
        local_28 = local_28 + dVar8;
        lVar7 = lVar7 + 1;
        lVar3 = lVar3 + 0x28;
      } while (lVar7 < vocab_size);
    }
    dVar8 = pow((double)vocab->cn,0.75);
    dVar8 = dVar8 / local_28;
    lVar3 = 0;
    iVar4 = 0;
    piVar2 = table;
    do {
      piVar2[lVar3] = iVar4;
      if ((double)(int)lVar3 / 100000000.0 <= dVar8) {
        lVar7 = (long)iVar4;
      }
      else {
        iVar4 = iVar4 + 1;
        lVar7 = (long)iVar4;
        dVar9 = pow((double)vocab[lVar7].cn,0.75);
        dVar8 = dVar8 + dVar9 / local_28;
        piVar2 = table;
      }
      if (vocab_size <= lVar7) {
        iVar4 = (int)vocab_size + -1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 100000000);
    return;
  }
  InitUnigramTable_cold_1();
  iVar4 = feof(in_RSI);
  uVar5 = 0;
  if (iVar4 == 0) {
    uVar5 = 0;
    do {
      uVar1 = fgetc(in_RSI);
      if (uVar1 != 0xd) {
        if ((uVar1 < 0x21) && ((0x100000600U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
          if (uVar5 != 0) {
            if (uVar1 == 10) {
              ungetc(10,in_RSI);
            }
            break;
          }
          if (uVar1 == 10) {
            *(undefined1 *)(puVar6 + 1) = 0;
            *puVar6 = 0x3e732f3c;
            return;
          }
        }
        else {
          *(char *)((long)puVar6 + (ulong)uVar5) = (char)uVar1;
          uVar5 = uVar5 + (uVar5 < 0x62);
        }
      }
      iVar4 = feof(in_RSI);
    } while (iVar4 == 0);
  }
  *(undefined1 *)((long)puVar6 + (long)(int)uVar5) = 0;
  return;
}

Assistant:

void InitUnigramTable() {
  int a, i;
  double train_words_pow = 0;
  double d1, power = 0.75;
  table = (int *)malloc(table_size * sizeof(int));
  if (table == NULL) {
    fprintf(stderr, "cannot allocate memory for the table\n");
    exit(1);
  }
  for (a = 0; a < vocab_size; a++) train_words_pow += pow(vocab[a].cn, power);
  i = 0;
  d1 = pow(vocab[i].cn, power) / train_words_pow;
  for (a = 0; a < table_size; a++) {
    table[a] = i;
    if (a / (double)table_size > d1) {
      i++;
      d1 += pow(vocab[i].cn, power) / train_words_pow;
    }
    if (i >= vocab_size) i = vocab_size - 1;
  }
}